

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::NodeScalar::set_ref_maybe_replacing_scalar(NodeScalar *this,csubstr ref,bool has_scalar)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  ro_substr pattern;
  basic_substring<const_char> local_30;
  
  sVar2 = ref.len;
  pcVar4 = ref.str;
  pcVar5 = pcVar4;
  if (sVar2 == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = sVar2;
    if (*pcVar4 == '*') {
      basic_substring<const_char>::basic_substring(&local_30,pcVar4 + 1,sVar2 - 1);
      sVar3 = local_30.len;
      pcVar5 = local_30.str;
    }
  }
  (this->anchor).str = pcVar5;
  (this->anchor).len = sVar3;
  if ((has_scalar) &&
     (pattern.len = sVar3, pattern.str = pcVar5,
     bVar1 = basic_substring<const_char>::ends_with(&this->scalar,pattern), bVar1)) {
    return;
  }
  (this->scalar).str = pcVar4;
  (this->scalar).len = sVar2;
  return;
}

Assistant:

void set_ref_maybe_replacing_scalar(csubstr ref, bool has_scalar) noexcept
    {
        csubstr trimmed = ref.begins_with('*') ? ref.sub(1) : ref;
        anchor = trimmed;
        if((!has_scalar) || !scalar.ends_with(trimmed))
            scalar = ref;
    }